

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbiw__zlib_bitrev(int code,int codebits)

{
  undefined4 local_14;
  undefined4 local_10;
  int res;
  int codebits_local;
  int code_local;
  
  local_14 = 0;
  local_10 = codebits;
  res = code;
  while (local_10 != 0) {
    local_14 = local_14 << 1 | res & 1U;
    res = res >> 1;
    local_10 = local_10 + -1;
  }
  return local_14;
}

Assistant:

static int stbiw__zlib_bitrev(int code, int codebits) {
  int res = 0;
  while (codebits--) {
    res = (res << 1) | (code & 1);
    code >>= 1;
  }
  return res;
}